

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O1

void avaluem(double *w,int N,int p,int q,double *phi,double *theta,int tval,double *a)

{
  int iVar1;
  void *__s;
  void *__s_00;
  long lVar2;
  void *__s_01;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  int iVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  double *pdVar16;
  double *pdVar17;
  uint uVar18;
  long lVar19;
  double dVar20;
  
  __s = malloc((long)N * 8);
  __s_00 = malloc((long)tval << 3);
  uVar18 = q;
  if (q < p) {
    uVar18 = p;
  }
  iVar1 = tval + N;
  lVar2 = (long)(int)(iVar1 + uVar18);
  __s_01 = malloc(lVar2 * 8);
  if (0 < N) {
    memset(__s,0,(ulong)(uint)N << 3);
  }
  if (0 < (int)(iVar1 + uVar18)) {
    memset(__s_01,0,(ulong)((uVar18 + iVar1) - 1) * 8 + 8);
  }
  if (1 < iVar1) {
    memset(a,0,(ulong)(iVar1 - 1) << 3);
  }
  if (0 < tval) {
    memset(__s_00,0,(ulong)(uint)tval * 8);
  }
  uVar3 = (ulong)(uint)p;
  uVar4 = (ulong)(uint)q;
  if (-1 < (int)(~uVar18 + N)) {
    uVar15 = (ulong)(~uVar18 + N);
    pdVar8 = w + uVar15 + 1;
    lVar10 = (long)__s + uVar15 * 8 + 8;
    do {
      if (p < 1) {
        dVar20 = 0.0;
      }
      else {
        dVar20 = 0.0;
        uVar12 = 0;
        do {
          dVar20 = dVar20 - phi[uVar12] * pdVar8[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
      }
      if (0 < q) {
        uVar12 = 0;
        do {
          dVar20 = dVar20 + theta[uVar12] * *(double *)(lVar10 + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
      }
      *(double *)((long)__s + uVar15 * 8) = dVar20 + w[uVar15];
      pdVar8 = pdVar8 + -1;
      lVar10 = lVar10 + -8;
      iVar5 = (int)uVar15;
      uVar15 = uVar15 - 1;
    } while (0 < iVar5);
  }
  if (0 < tval) {
    pdVar6 = (double *)((long)__s_00 + -8);
    lVar10 = 0;
    uVar15 = 0;
    pvVar11 = __s;
    pdVar8 = w;
    do {
      if (p < 1) {
        dVar20 = 0.0;
      }
      else {
        dVar20 = 0.0;
        uVar12 = 0;
        pdVar16 = pdVar6;
        pdVar17 = pdVar8;
        do {
          pdVar7 = pdVar17;
          if ((long)(lVar10 + uVar12) < 0) {
            pdVar7 = pdVar16;
          }
          dVar20 = dVar20 - phi[uVar12] * *pdVar7;
          uVar12 = uVar12 + 1;
          pdVar17 = pdVar17 + 1;
          pdVar16 = pdVar16 + -1;
        } while (uVar3 != uVar12);
      }
      if (0 < q) {
        uVar12 = 0;
        do {
          if (-1 < (long)(lVar10 + uVar12)) {
            dVar20 = dVar20 + theta[uVar12] * *(double *)((long)pvVar11 + uVar12 * 8);
          }
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
      }
      *(double *)((long)__s_00 + uVar15 * 8) = -dVar20;
      uVar15 = uVar15 + 1;
      pdVar8 = pdVar8 + -1;
      lVar10 = lVar10 + -1;
      pdVar6 = pdVar6 + 1;
      pvVar11 = (void *)((long)pvVar11 + -8);
    } while (uVar15 != (uint)tval);
  }
  if (0 < iVar1) {
    iVar9 = uVar18 + tval;
    iVar5 = p;
    if (p < q) {
      iVar5 = q;
    }
    lVar10 = (long)iVar5;
    iVar13 = iVar9 - iVar5;
    iVar5 = iVar5 + -1;
    do {
      if (p < 1) {
        dVar20 = 0.0;
      }
      else {
        dVar20 = 0.0;
        lVar19 = 0;
        iVar14 = iVar5;
        do {
          if (iVar14 < iVar9) {
            if ((int)uVar18 <= iVar14) {
              pdVar8 = (double *)((long)__s_00 + lVar19 + (long)iVar13 * 8);
              goto LAB_001351ba;
            }
          }
          else {
            pdVar8 = w + (iVar14 - iVar9);
LAB_001351ba:
            dVar20 = dVar20 - *(double *)((long)phi + lVar19) * *pdVar8;
          }
          lVar19 = lVar19 + 8;
          iVar14 = iVar14 + -1;
        } while (uVar3 << 3 != lVar19);
      }
      if (0 < q) {
        uVar15 = 0;
        iVar14 = iVar5;
        do {
          if ((int)uVar18 <= iVar14) {
            dVar20 = dVar20 + theta[uVar15] * *(double *)((long)__s_01 + (long)iVar14 * 8);
          }
          uVar15 = uVar15 + 1;
          iVar14 = iVar14 + -1;
        } while (uVar4 != uVar15);
      }
      if (lVar10 < iVar9) {
        if ((int)uVar18 <= lVar10) {
          iVar14 = iVar9 - (int)lVar10;
          pdVar8 = (double *)((long)__s_00 + -8);
          goto LAB_00135233;
        }
      }
      else {
        iVar14 = (int)lVar10 - iVar9;
        pdVar8 = w;
LAB_00135233:
        *(double *)((long)__s_01 + lVar10 * 8) = dVar20 + pdVar8[iVar14];
      }
      lVar10 = lVar10 + 1;
      iVar13 = iVar13 + -1;
      iVar5 = iVar5 + 1;
    } while (lVar10 < lVar2);
  }
  if (1 < iVar1) {
    lVar10 = 0;
    do {
      a[(int)lVar10] = *(double *)((long)__s_01 + lVar10 * 8 + (long)(int)(uVar18 + 1) * 8);
      lVar19 = (int)(uVar18 + 1) + lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar19 + 1 < lVar2);
  }
  free(__s);
  free(__s_00);
  free(__s_01);
  return;
}

Assistant:

void avaluem(double *w,int N,int p, int q, double *phi,double *theta,int tval,double *a) {
	int k,i,t,t2,newl,iter;
	double temp;
	double *e,*w2,*alpha;


	e = (double*) malloc(sizeof(double) * N);
	w2 = (double*) malloc(sizeof(double) * tval);

	if (p > q) {
		k = p;
	} else {
		k = q;
	}

	alpha = (double*) malloc(sizeof(double) * (tval+N+k));


	for(i = 0; i < N;++i) {
		e[i] = 0.0;
	}

	for(i = 0; i < N+tval+k;++i) {
		alpha[i] = 0.0;
	}

	for(i = 0; i < N+tval-1;++i) {
		a[i] = 0.0;
	}

	for(i = 0; i < tval;++i) {
		w2[i] = 0.0;
	}

	for(i = N-k-1; i >= 0; --i) {
		temp = 0.0;

		for (t = 0; t < p;++t) {
			temp = temp - phi[t] * w[i+t+1];
		}

		for ( t2 = 0; t2 < q;++t2) {
			temp = temp + theta[t2] * e[t2+i+1];
		}

		e[i] = w[i] + temp;
	}
/*
	for(i = 0; i < N;++i) {
		printf("%g \n",e[i]);
	}
*/

	for(i = 0; i < tval;++i) {
		temp = 0.0;
		for(t = 0; t < p;++t) {
			if (t-i < 0) {
				temp = temp - phi[t]*w2[i-t-1];
			} else {
				temp = temp - phi[t]*w[t-i];
			}
			//printf("temp %g \n",temp);

		}

		for(t2 = 0; t2 < q;++t2) {
			if (t2-i >= 0) {
				temp=temp+theta[t2]*e[t2-i];
			}
		}
		w2[i] = -temp;
	}
/*
	for(i = 0; i < tval;++i) {
		printf("%g \n",w2[i]);
	}
*/


	newl = N + tval;
	

	for (iter = k; iter < newl+k;iter++) {
		temp = 0.0;
		for (t = 0; t < p;++t) {
			if (iter-t-1 >= tval+k ) {
				temp = temp - phi[t] * w[iter-t-1-tval-k];
			} else if (iter-t-1 < tval+k && iter-t-1 >= k) {
				temp = temp - phi[t] * w2[k-iter+tval+t];
			}
		}
		
		for (t2 = 0; t2 < q; ++t2) {
			if (iter-t2-1 >= k ) {
				temp = temp + theta[t2] * alpha[iter-t2-1];
			}
		}

		//printf("%g \n",temp);

		if (iter >= tval+k) {
			alpha[iter] = w[iter-tval-k] + temp;
		} else if (iter >= k){
			alpha[iter] = w2[k-iter+tval-1] + temp;
		}
	}

	for (iter = k+1; iter < newl+k;iter++) {
		a[iter-k-1] = alpha[iter];
	}

	free(e);
	free(w2);
	free(alpha);
}